

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O3

void __thiscall Configuration::Configuration(Configuration *this)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  bool bVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  char *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  string *local_88;
  string *local_80;
  string *local_78;
  string *local_70;
  anon_union_16_2_ba345be5_for_m_Storage local_68;
  ulong local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->m_debug = false;
  this->m_verbose = false;
  local_70 = &this->m_baseURL;
  local_90 = &(this->m_baseURL).field_2;
  (this->m_baseURL)._M_dataplus._M_p = (pointer)local_90;
  (this->m_baseURL)._M_string_length = 0;
  (this->m_baseURL).field_2._M_local_buf[0] = '\0';
  local_78 = &this->m_baseDir;
  local_98 = &(this->m_baseDir).field_2;
  (this->m_baseDir)._M_dataplus._M_p = (pointer)local_98;
  (this->m_baseDir)._M_string_length = 0;
  (this->m_baseDir).field_2._M_local_buf[0] = '\0';
  local_80 = &this->m_username;
  (this->m_username)._M_dataplus._M_p = (pointer)&(this->m_username).field_2;
  (this->m_username)._M_string_length = 0;
  (this->m_username).field_2._M_local_buf[0] = '\0';
  local_88 = &this->m_password;
  (this->m_password)._M_dataplus._M_p = (pointer)&(this->m_password).field_2;
  (this->m_password)._M_string_length = 0;
  (this->m_password).field_2._M_local_buf[0] = '\0';
  this->m_segment_duration = 0;
  this->m_max_backlog_total_segment_duration = 300;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,".ts","");
  __l._M_len = 1;
  __l._M_array = &local_50;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_extensions,__l,(allocator_type *)&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = getenv("CAMERA_DEBUG");
  local_a0 = pcVar3;
  if (pcVar3 != (char *)0x0) {
    bVar7 = true;
    if (*pcVar3 != '\0') {
      iVar2 = strncasecmp(pcVar3,"true",4);
      if (iVar2 != 0) {
        lVar4 = strtol(pcVar3,(char **)0x0,0);
        bVar7 = lVar4 != 0;
      }
    }
    this->m_debug = bVar7;
  }
  pcVar3 = getenv("CAMERA_BASE_URL");
  if (pcVar3 != (char *)0x0) {
    pcVar1 = (char *)(this->m_baseURL)._M_string_length;
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)local_70,0,pcVar1,(ulong)pcVar3);
  }
  pcVar3 = getenv("CAMERA_BASE_DIR");
  if (pcVar3 != (char *)0x0) {
    pcVar1 = (char *)(this->m_baseDir)._M_string_length;
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)local_78,0,pcVar1,(ulong)pcVar3);
  }
  pcVar3 = getenv("CAMERA_USERNAME");
  if (pcVar3 != (char *)0x0) {
    pcVar1 = (char *)(this->m_username)._M_string_length;
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)local_80,0,pcVar1,(ulong)pcVar3);
  }
  pcVar3 = getenv("CAMERA_PASSWORD");
  if (pcVar3 != (char *)0x0) {
    pcVar1 = (char *)(this->m_password)._M_string_length;
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)local_88,0,pcVar1,(ulong)pcVar3);
  }
  pcVar3 = getenv("CAMERA_SEGMENT_DURATION");
  if (pcVar3 != (char *)0x0) {
    sVar5 = strtoll(pcVar3,(char **)0x0,10);
    this->m_segment_duration = sVar5;
  }
  pcVar3 = getenv("CAMERA_MAX_BACKLOG_TOTAL_SEGMENT_DURATION");
  if (pcVar3 == (char *)0x0) {
    uVar6 = this->m_max_backlog_total_segment_duration;
  }
  else {
    uVar6 = strtoll(pcVar3,(char **)0x0,10);
    this->m_max_backlog_total_segment_duration = uVar6;
  }
  if ((uVar6 != 0) && (uVar6 < this->m_segment_duration)) {
    this->m_max_backlog_total_segment_duration = this->m_segment_duration;
  }
  local_a0 = getenv("CAMERA_SEGMENT_EXTENSIONS");
  if (local_a0 != (char *)0x0) {
    local_50._M_dataplus._M_p = " \t";
    local_50._M_string_length = 0x12e5a0;
    boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
              ((is_any_ofF<char> *)&local_68,(iterator_range<const_char_*> *)&local_50);
    boost::algorithm::
    split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char*&,boost::algorithm::detail::is_any_ofF<char>>
              (&this->m_extensions,&local_a0,(is_any_ofF<char> *)&local_68,token_compress_on);
    if ((0x10 < local_58) && (local_68.m_dynSet != (set_value_type *)0x0)) {
      operator_delete__(local_68.m_dynSet);
    }
  }
  return;
}

Assistant:

Configuration::Configuration()
{
    char* pValue;

    if ((pValue = getenv("CAMERA_DEBUG")) != nullptr)
    {
        m_debug = strlen(pValue) == 0 || strncasecmp(pValue, "true", 4) == 0 || strtol(pValue, nullptr, 0) != 0;
    }

    if ((pValue = getenv("CAMERA_BASE_URL")) != nullptr)
    {
        m_baseURL = pValue;
    }

    if ((pValue = getenv("CAMERA_BASE_DIR")) != nullptr)
    {
        m_baseDir = pValue;
    }

    if ((pValue = getenv("CAMERA_USERNAME")) != nullptr)
    {
        m_username = pValue;
    }

    if ((pValue = getenv("CAMERA_PASSWORD")) != nullptr)
    {
        m_password = pValue;
    }

    if ((pValue = getenv("CAMERA_SEGMENT_DURATION")) != nullptr)
    {
        m_segment_duration = static_cast<size_t>(strtoll(pValue, nullptr, 10));
    }

    if ((pValue = getenv("CAMERA_MAX_BACKLOG_TOTAL_SEGMENT_DURATION")) != nullptr)
    {
        m_max_backlog_total_segment_duration = static_cast<size_t>(strtoll(pValue, nullptr, 10));
    }

    // It makes sense to keep at least one file around...
    if (m_max_backlog_total_segment_duration > 0 && m_max_backlog_total_segment_duration < m_segment_duration)
    {
        m_max_backlog_total_segment_duration = m_segment_duration;
    }

    if ((pValue = getenv("CAMERA_SEGMENT_EXTENSIONS")) != nullptr)
    {
        boost::algorithm::split(m_extensions, pValue, boost::algorithm::is_any_of(" \t"), boost::algorithm::token_compress_on);
    }
}